

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bounds.cpp
# Opt level: O1

void __thiscall libDAI::BoundTree::display(BoundTree *this,ostream *os,FactorGraph *fg)

{
  char cVar1;
  ostream *poVar2;
  long *plVar3;
  long lVar4;
  long *plVar5;
  char *pcVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"digraph G {",0xb);
  cVar1 = (char)os;
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"node[shape=circle,width=0.4,fixedsize=true];",0x2c);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  plVar5 = *(long **)(*(long *)&this->tr + 0x20);
  if (*(long **)&this->field_0x20 != plVar5) {
    do {
      if ((int)plVar5[7] == 0) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"\t",1);
        poVar2 = libDAI::operator<<(os,(BoundTreeNode *)(plVar5 + 5));
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[label=v",8);
        (*(fg->super_GraphicalModel)._vptr_GraphicalModel[6])(fg,plVar5[6]);
        std::ostream::_M_insert<long>((long)poVar2);
        if (*(char *)((long)plVar5 + 0x3c) == '\x01') {
          lVar4 = 0x1a;
          pcVar6 = ",color=gray,style=filled];";
        }
        else {
          lVar4 = 2;
          pcVar6 = "];";
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,lVar4);
        std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
      }
      plVar3 = (long *)plVar5[1];
      if (plVar3 == (long *)0x0) {
        do {
          plVar3 = (long *)plVar5[4];
          if (plVar3 != (long *)0x0) break;
          plVar3 = (long *)*plVar5;
          plVar5 = plVar3;
        } while (plVar3 != (long *)0x0);
      }
      plVar5 = plVar3;
    } while (*(long **)&this->field_0x20 != plVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"node[shape=box,width=0.3,height=0.3,fixedsize=true];",0x34);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  plVar5 = *(long **)(*(long *)&this->tr + 0x20);
  if (*(long **)&this->field_0x20 != plVar5) {
    do {
      if ((int)plVar5[7] == 1) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"\t",1);
        poVar2 = libDAI::operator<<(os,(BoundTreeNode *)(plVar5 + 5));
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[label=f",8);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        if (*(char *)((long)plVar5 + 0x3c) == '\x01') {
          lVar4 = 0x1a;
          pcVar6 = ",color=gray,style=filled];";
        }
        else {
          lVar4 = 2;
          pcVar6 = "];";
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,lVar4);
        std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
      }
      plVar3 = (long *)plVar5[1];
      if (plVar3 == (long *)0x0) {
        do {
          plVar3 = (long *)plVar5[4];
          if (plVar3 != (long *)0x0) break;
          plVar3 = (long *)*plVar5;
          plVar5 = plVar3;
        } while (plVar3 != (long *)0x0);
      }
      plVar5 = plVar3;
    } while (*(long **)&this->field_0x20 != plVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"edge[color=black];",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  plVar5 = *(long **)(*(long *)&this->tr + 0x20);
  if (*(long **)&this->field_0x20 != plVar5) {
    do {
      if (*(long **)(*(long *)&this->tr + 0x20) != plVar5) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"\t",1);
        poVar2 = libDAI::operator<<(os,(BoundTreeNode *)(*plVar5 + 0x28));
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," -> ",4);
        poVar2 = libDAI::operator<<(poVar2,(BoundTreeNode *)(plVar5 + 5));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
      }
      plVar3 = (long *)plVar5[1];
      if (plVar3 == (long *)0x0) {
        do {
          plVar3 = (long *)plVar5[4];
          if (plVar3 != (long *)0x0) break;
          plVar3 = (long *)*plVar5;
          plVar5 = plVar3;
        } while (plVar3 != (long *)0x0);
      }
      plVar5 = plVar3;
    } while (*(long **)&this->field_0x20 != plVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"}",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  return;
}

Assistant:

void BoundTree::display( std::ostream & os, const FactorGraph &fg ) {
//        if( true ) {
        os << "digraph G {" << endl;

        // variables
        os << "node[shape=circle,width=0.4,fixedsize=true];" << endl;
        for( tree<BoundTreeNode>::iterator node = tr.begin(); node != tr.end(); node++ )
            if( node->_type == BoundTreeNode::VAR ) {
                os << "\t" << (*node) << "[label=v" << fg.var(node->_index).label();
                if( node->_forcedleaf )
                    os << ",color=gray,style=filled];" << endl;
                else
                    os << "];" << endl;
            }

        //factors 
        os << "node[shape=box,width=0.3,height=0.3,fixedsize=true];" << endl;
        for( tree<BoundTreeNode>::iterator node = tr.begin(); node != tr.end(); node++ )
            if( node->_type == BoundTreeNode::FACTOR ) {
                os << "\t" << (*node) << "[label=f" << node->_index;
                if( node->_forcedleaf )
                    os << ",color=gray,style=filled];" << endl;
                else
                    os << "];" << endl;
            }

        // edges
        os << "edge[color=black];" << endl;
        for( tree<BoundTreeNode>::iterator node = tr.begin(); node != tr.end(); node++ )
            if( node != tr.begin() )
                os << "\t" << (*tr.parent(node)) << " -> " << (*node) << endl;

        os << "}" << endl;
/*        } else {
            os << "graph G {" << endl;

            // variables
            os << "node[shape=circle,width=0.4,fixedsize=true,color=lightgray];" << endl;
            for( size_t j = 0; j < fg.nrVars(); j++ ) {
                os << "\tv" << fg.var(j).label();
                tree<BoundTreeNode>::iterator node = find( BoundTreeNode::VAR, j );
                if( node == tr.begin() )
                    os << "[color=blue,style=filled];" << endl;
                else if( node != tr.end() ) {
                    if( node->_forcedleaf )
                        os << "[color=blue,style=filled];" << endl;
                    else
                        os << "[color=blue];" << endl;
                } else
                    os << ";" << endl;
            }

            //factors 
            os << "node[shape=box,width=0.3,height=0.3,fixedsize=true,color=lightgray];" << endl;
            for( size_t I = 0; I < fg.nrFactors(); I++ ) {
                os << "\tf" << I;
                tree<BoundTreeNode>::iterator node = find( BoundTreeNode::FACTOR, I );
                if( node != tr.end() ) {
                    if( node->_forcedleaf )
                        os << "[color=blue,style=filled];" << endl;
                    else
                        os << "[color=blue];" << endl;
                } else
                    os << ";" << endl;
            }

            // edges
            os << "edge[color=lightgray];" << endl;
            for( size_t e = 0; e < fg.nrEdges(); e++ ) {
                size_t i = fg.edge(e).first;
                size_t I = fg.edge(e).second;
                if( containsEdge( i, I ) )
                    os << "\tv" << fg.var(i).label() << " -- f" << I << "[color=blue];" << endl;
                else
                    os << "\tv" << fg.var(i).label() << " -- f" << I << ";" << endl;
            }
            os << "}" << endl;
        }*/
    }